

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

LogEst sqlite3LogEstFromDouble(double x)

{
  LogEst LVar1;
  
  if (x <= 1.0) {
    return 0;
  }
  if (2000000000.0 < x) {
    return (ushort)((ulong)x >> 0x34) * 10 + -0x27ec;
  }
  LVar1 = sqlite3LogEst((long)(x - 9.223372036854776e+18) & (long)x >> 0x3f | (long)x);
  return LVar1;
}

Assistant:

SQLITE_PRIVATE LogEst sqlite3LogEstFromDouble(double x){
  u64 a;
  LogEst e;
  assert( sizeof(x)==8 && sizeof(a)==8 );
  if( x<=1 ) return 0;
  if( x<=2000000000 ) return sqlite3LogEst((u64)x);
  memcpy(&a, &x, 8);
  e = (a>>52) - 1022;
  return e*10;
}